

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractListView<QImage>::setModel(AbstractListView<QImage> *this,ListModel<QImage> *m)

{
  ConnectionType type;
  Object local_c8;
  undefined8 uStack_b8;
  code *local_b0;
  undefined8 local_a8;
  Connection local_a0 [8];
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 local_80;
  Connection local_78 [8];
  undefined8 local_70;
  undefined8 uStack_68;
  code *local_60;
  undefined8 local_58;
  Connection local_50 [8];
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 local_30;
  Connection local_28 [8];
  AbstractListViewPrivate<QImage> *local_20;
  AbstractListViewPrivate<QImage> *d;
  ListModel<QImage> *m_local;
  AbstractListView<QImage> *this_local;
  
  d = (AbstractListViewPrivate<QImage> *)m;
  m_local = (ListModel<QImage> *)this;
  local_20 = d_func(this);
  if (local_20->model != (ListModel<QImage> *)0x0) {
    QObject::disconnect((QObject *)local_20->model,(char *)0x0,(QObject *)this,(char *)0x0);
  }
  local_20->model = (ListModel<QImage> *)d;
  local_38 = AbstractListModel::dataChanged;
  local_30 = 0;
  uStack_40 = 0;
  local_48 = 0x1c1;
  type = (ConnectionType)this;
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int)>
            ((Object *)local_28,(offset_in_AbstractListModel_to_subr)local_20->model,
             (Object *)AbstractListModel::dataChanged,0,type);
  QMetaObject::Connection::~Connection(local_28);
  local_60 = AbstractListModel::modelReset;
  local_58 = 0;
  uStack_68 = 0;
  local_70 = 0x1c9;
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(),void(QtMWidgets::AbstractListView<QImage>::*)()>
            ((Object *)local_50,(offset_in_AbstractListModel_to_subr)local_20->model,
             (Object *)AbstractListModel::modelReset,0,type);
  QMetaObject::Connection::~Connection(local_50);
  local_88 = AbstractListModel::rowsInserted;
  local_80 = 0;
  uStack_90 = 0;
  local_98 = 0x1d1;
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int)>
            ((Object *)local_78,(offset_in_AbstractListModel_to_subr)local_20->model,
             (Object *)AbstractListModel::rowsInserted,0,type);
  QMetaObject::Connection::~Connection(local_78);
  local_b0 = AbstractListModel::rowsRemoved;
  local_a8 = 0;
  uStack_b8 = 0;
  local_c8._8_8_ = 0x1d9;
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int)>
            ((Object *)local_a0,(offset_in_AbstractListModel_to_subr)local_20->model,
             (Object *)AbstractListModel::rowsRemoved,0,type);
  QMetaObject::Connection::~Connection(local_a0);
  QObject::
  connect<void(QtMWidgets::AbstractListModel::*)(int,int,int),void(QtMWidgets::AbstractListView<QImage>::*)(int,int,int)>
            (&local_c8,(offset_in_AbstractListModel_to_subr)local_20->model,
             (Object *)AbstractListModel::rowsMoved,0,type);
  QMetaObject::Connection::~Connection((Connection *)&local_c8);
  return;
}

Assistant:

void setModel( ListModel< T > * m )
	{
		AbstractListViewPrivate< T > * d = d_func();

		if( d->model )
			disconnect( d->model, 0, this, 0 );

		d->model = m;

		connect( d->model, &ListModel< T >::dataChanged,
			this, &AbstractListView< T >::dataChanged );
		connect( d->model, &ListModel< T >::modelReset,
			this, &AbstractListView< T >::modelReset );
		connect( d->model, &ListModel< T >::rowsInserted,
			this, &AbstractListView< T >::rowsInserted );
		connect( d->model, &ListModel< T >::rowsRemoved,
			this, &AbstractListView< T >::rowsRemoved );
		connect( d->model, &ListModel< T >::rowsMoved,
			this, &AbstractListView< T >::rowsMoved );
	}